

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.h
# Opt level: O2

string * __thiscall
google::protobuf::stringpiece_internal::StringPiece::ToString_abi_cxx11_
          (string *__return_storage_ptr__,StringPiece *this)

{
  char *pcVar1;
  size_type sVar2;
  allocator local_9;
  
  pcVar1 = this->ptr_;
  if (pcVar1 == (char *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_9);
  }
  else {
    sVar2 = this->length_;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + sVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const {
    if (ptr_ == nullptr) return "";
    return std::string(data(), static_cast<size_type>(size()));
  }